

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O0

void nsync::nsync_cv_signal(nsync_cv *pcv)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  nsync_dll_element_ *pnVar6;
  nsync_dll_list_ pnVar7;
  uint32_t old_value_1;
  int should_wake;
  nsync_waiter_s *p_nw;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p;
  int woke_writer;
  uint32_t old_value;
  nsync_dll_element_ *first;
  nsync_waiter_s *first_nw;
  uint32_t old_word;
  int all_readers;
  nsync_dll_list_ to_wake_list;
  nsync_cv *pcv_local;
  
  uVar4 = std::atomic_load_explicit<unsigned_int>(&pcv->word,memory_order_acquire);
  if ((uVar4 & 2) != 0) {
    _old_word = (nsync_dll_list_)0x0;
    first_nw._4_4_ = 0;
    first_nw._0_4_ = nsync_spin_test_and_set_(&pcv->word,1,1,0);
    iVar5 = nsync_dll_is_empty_(pcv->waiters);
    if (iVar5 == 0) {
      pnVar6 = nsync_dll_first_(pcv->waiters);
      pnVar7 = nsync_dll_remove_(pcv->waiters,pnVar6);
      pcv->waiters = pnVar7;
      pvVar1 = pnVar6->container;
      if ((*(uint *)((long)pvVar1 + 0x30) & 1) != 0) {
        do {
          uVar4 = std::atomic_load_explicit<unsigned_int>
                            ((atomic<unsigned_int> *)((long)pnVar6->container + 0x48),
                             memory_order_relaxed);
          iVar5 = atm_cas_nomb_u32_((nsync_atomic_uint32_ *)((long)pnVar6->container + 0x48),uVar4,
                                    uVar4 + 1);
        } while (iVar5 == 0);
      }
      _old_word = nsync_dll_make_last_in_list_((nsync_dll_list_)0x0,pnVar6);
      if (((*(uint *)((long)pvVar1 + 0x30) & 1) != 0) &&
         (*(undefined **)((long)pnVar6->container + 0x40) == nsync_reader_type_)) {
        first_nw._4_4_ = 1;
        bVar3 = false;
        pnVar6 = nsync_dll_first_(pcv->waiters);
        while (next = pnVar6, next != (nsync_dll_element_ *)0x0) {
          pvVar1 = next->container;
          pnVar6 = nsync_dll_next_(pcv->waiters,next);
          if (((*(uint *)((long)pvVar1 + 0x30) & 1) == 0) ||
             (*(undefined **)((long)next->container + 0x40) != nsync_reader_type_)) {
            bVar2 = !bVar3;
            if (bVar2) {
              bVar3 = true;
              first_nw._4_4_ = 0;
            }
          }
          else {
            bVar2 = true;
          }
          if (bVar2) {
            pnVar7 = nsync_dll_remove_(pcv->waiters,next);
            pcv->waiters = pnVar7;
            if ((*(uint *)((long)pvVar1 + 0x30) & 1) != 0) {
              do {
                uVar4 = std::atomic_load_explicit<unsigned_int>
                                  ((atomic<unsigned_int> *)((long)next->container + 0x48),
                                   memory_order_relaxed);
                iVar5 = atm_cas_nomb_u32_((nsync_atomic_uint32_ *)((long)next->container + 0x48),
                                          uVar4,uVar4 + 1);
              } while (iVar5 == 0);
            }
            _old_word = nsync_dll_make_last_in_list_(_old_word,next);
          }
        }
      }
      iVar5 = nsync_dll_is_empty_(pcv->waiters);
      if (iVar5 != 0) {
        first_nw._0_4_ = (uint32_t)first_nw & 0xfffffffd;
      }
    }
    std::atomic_store_explicit<unsigned_int>(&pcv->word,(uint32_t)first_nw,memory_order_release);
    iVar5 = nsync_dll_is_empty_(_old_word);
    if (iVar5 == 0) {
      wake_waiters(_old_word,first_nw._4_4_);
    }
  }
  return;
}

Assistant:

void nsync_cv_signal (nsync_cv *pcv) {
	IGNORE_RACES_START ();
	if ((ATM_LOAD_ACQ (&pcv->word) & CV_NON_EMPTY) != 0) { /* acquire load */
		nsync_dll_list_ to_wake_list = NULL; /* waiters that we will wake */
		int all_readers = 0;
		/* acquire spinlock */
		uint32_t old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK,
							      CV_SPINLOCK, 0);
		if (!nsync_dll_is_empty_ (pcv->waiters)) {
			/* Point to first waiter that enqueued itself, and
			   detach it from all others.  */
			struct nsync_waiter_s *first_nw;
			nsync_dll_element_ *first = nsync_dll_first_ (pcv->waiters);
			pcv->waiters = nsync_dll_remove_ (pcv->waiters, first);
			first_nw = DLL_NSYNC_WAITER (first);
			if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
				uint32_t old_value;
				do {    
					old_value =
						ATM_LOAD (&DLL_WAITER (first)->remove_count);
				} while (!ATM_CAS (&DLL_WAITER (first)->remove_count,
						   old_value, old_value+1));
			}
			to_wake_list = nsync_dll_make_last_in_list_ (to_wake_list, first);
			if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
			    DLL_WAITER (first)->l_type == nsync_reader_type_) {
				int woke_writer;
				/* If the first waiter is a reader, wake all readers, and
				   if it's possible, one writer.  This allows reader-regions
				   to be added to a monitor without invalidating code in which
				   a client has optimized broadcast calls by converting them to 
				   signal calls.  In particular, we wake a writer when waking
				   readers because the readers will not invalidate the condition
				   that motivated the client to call nsync_cv_signal().  But we
				   wake at most one writer because the first writer may invalidate
				   the condition; the client is expecting only one writer to be
				   able make use of the wakeup, or he would have called
				   nsync_cv_broadcast().  */
				nsync_dll_element_ *p = NULL;
				nsync_dll_element_ *next = NULL;
				all_readers = 1;
				woke_writer = 0;
				for (p = nsync_dll_first_ (pcv->waiters); p != NULL; p = next) {
					struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
					int should_wake;
					next = nsync_dll_next_ (pcv->waiters, p);
					should_wake = 0;
					if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
					     DLL_WAITER (p)->l_type == nsync_reader_type_) {
						should_wake = 1;
					} else if (!woke_writer) {
						woke_writer = 1;
						all_readers = 0;
						should_wake = 1;
					}
					if (should_wake) {
						pcv->waiters = nsync_dll_remove_ (pcv->waiters, p);
						if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
							uint32_t old_value;
							do {    
								old_value = ATM_LOAD (
								    &DLL_WAITER (p)->remove_count);
							} while (!ATM_CAS (&DLL_WAITER (p)->remove_count,
									   old_value, old_value+1));
						}
						to_wake_list = nsync_dll_make_last_in_list_ (
							to_wake_list, p);
					}
				}
			}
			if (nsync_dll_is_empty_ (pcv->waiters)) {
				old_word &= ~(CV_NON_EMPTY);
			}
		}
		/* Release spinlock. */
		ATM_STORE_REL (&pcv->word, old_word); /* release store */
		if (!nsync_dll_is_empty_ (to_wake_list)) {
			wake_waiters (to_wake_list, all_readers);
		}
	}
	IGNORE_RACES_END ();
}